

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::Array<capnp::_::RawBrandedSchema::Scope>::~Array(Array<capnp::_::RawBrandedSchema::Scope> *this)

{
  Scope *pSVar1;
  size_t sVar2;
  
  pSVar1 = this->ptr;
  if (pSVar1 != (Scope *)0x0) {
    sVar2 = this->size_;
    this->ptr = (Scope *)0x0;
    this->size_ = 0;
    (*(code *)**(undefined8 **)this->disposer)(this->disposer,pSVar1,0x18,sVar2,sVar2,0);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }